

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O3

void __thiscall Fossilize::Instance::Instance(Instance *this)

{
  bool bVar1;
  int iVar2;
  LogLevel LVar3;
  char *pcVar4;
  ulong uVar5;
  sigaction local_b0;
  
  ScratchAllocator::ScratchAllocator(&this->alloc);
  *(undefined8 *)((long)&this->gpa + 3) = 0;
  *(undefined8 *)((long)&this->infoFilter + 3) = 0;
  this->pTable = (VkLayerInstanceDispatchTable *)0x0;
  this->gpa = (PFN_vkGetInstanceProcAddr)0x0;
  this->pAppInfo = (VkApplicationInfo *)0x0;
  this->instance = (VkInstance)0x0;
  this->shouldRecordImmutableSamplers = true;
  pcVar4 = getenv("FOSSILIZE_DUMP_SIGSEGV");
  if (pcVar4 != (char *)0x0) {
    uVar5 = strtoul(pcVar4,(char **)0x0,0);
    if (uVar5 != 0) {
      memset(&local_b0,0,0x98);
      local_b0.sa_flags = -0x80000000;
      sigemptyset(&local_b0.sa_mask);
      local_b0.__sigaction_handler.sa_handler = segfaultHandler;
      iVar2 = sigaction(0xb,&local_b0,(sigaction *)0x0);
      if (iVar2 < 0) {
        LVar3 = get_thread_log_level();
        if ((int)LVar3 < 3) {
          bVar1 = Internal::log_thread_callback(LOG_ERROR,"Failed to install SIGSEGV handler!\n");
          if (!bVar1) {
            Fossilize::Instance();
          }
        }
      }
      iVar2 = sigaction(8,&local_b0,(sigaction *)0x0);
      if (iVar2 < 0) {
        LVar3 = get_thread_log_level();
        if ((int)LVar3 < 3) {
          bVar1 = Internal::log_thread_callback(LOG_ERROR,"Failed to install SIGFPE handler!\n");
          if (!bVar1) {
            Fossilize::Instance();
          }
        }
      }
      iVar2 = sigaction(6,&local_b0,(sigaction *)0x0);
      if (iVar2 < 0) {
        LVar3 = get_thread_log_level();
        if ((int)LVar3 < 3) {
          bVar1 = Internal::log_thread_callback(LOG_ERROR,"Failed to install SIGABRT handler!\n");
          if (!bVar1) {
            Fossilize::Instance();
          }
        }
      }
      this->enableCrashHandler = true;
    }
  }
  pcVar4 = getenv("FOSSILIZE_DUMP_SYNC");
  if (pcVar4 != (char *)0x0) {
    uVar5 = strtoul(pcVar4,(char **)0x0,0);
    if (uVar5 != 0) {
      this->synchronized = true;
    }
  }
  bVar1 = queryPrecompileQA();
  this->enablePrecompileQA = bVar1;
  return;
}

Assistant:

Instance::Instance()
{
#ifdef FOSSILIZE_LAYER_CAPTURE_SIGSEGV
#ifdef ANDROID
	auto sigsegv = getSystemProperty("debug.fossilize.dump_sigsegv");
	if (!sigsegv.empty() && strtoul(sigsegv.c_str(), nullptr, 0) != 0)
	{
		installSegfaultHandler();
		enableCrashHandler = true;
	}
#else
	const char *sigsegv = getenv("FOSSILIZE_DUMP_SIGSEGV");
	if (sigsegv && strtoul(sigsegv, nullptr, 0) != 0)
	{
		installSegfaultHandler();
		enableCrashHandler = true;
	}
#endif
#endif

#ifndef ANDROID
	const char *sync = getenv(FOSSILIZE_DUMP_SYNC_ENV);
	if (sync && strtoul(sync, nullptr, 0) != 0)
		synchronized = true;
#endif

	enablePrecompileQA = queryPrecompileQA();
}